

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int nni_pipe_alloc_dialer(void **datap,nni_dialer *d)

{
  nni_pipe *local_40;
  nni_pipe *p;
  nni_sock *s;
  nni_sp_tran *tran;
  nni_dialer *pnStack_20;
  int rv;
  nni_dialer *d_local;
  void **datap_local;
  
  s = (nni_sock *)d->d_tran;
  p = (nni_pipe *)d->d_sock;
  pnStack_20 = d;
  d_local = (nni_dialer *)datap;
  datap_local._4_4_ = pipe_create(&local_40,(nni_sock *)p,(nni_sp_tran *)s,d,(nni_listener *)0x0);
  if (datap_local._4_4_ == 0) {
    (d_local->d_ops).d_size = (size_t)local_40->p_tran_data;
    datap_local._4_4_ = 0;
  }
  return datap_local._4_4_;
}

Assistant:

int
nni_pipe_alloc_dialer(void **datap, nni_dialer *d)
{
	int          rv;
	nni_sp_tran *tran = d->d_tran;
	nni_sock    *s    = d->d_sock;
	nni_pipe    *p;

	if ((rv = pipe_create(&p, s, tran, d, NULL)) != 0) {
		return (rv);
	}
	*datap = p->p_tran_data;
	return (0);
}